

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFloat(Parser *this,ai_real *fOut)

{
  char *pcVar1;
  byte *c;
  
  for (c = (byte *)this->filePtr; (*c == 0x20 || (*c == 9)); c = c + 1) {
  }
  this->filePtr = (char *)c;
  if ((*c < 0xe) && ((0x3401U >> (*c & 0x1f) & 1) != 0)) {
    LogWarning(this,"Unable to parse float: unexpected EOL [#1]");
    *fOut = 0.0;
    this->iLineNumber = this->iLineNumber + 1;
  }
  else {
    pcVar1 = fast_atoreal_move<float>((char *)c,fOut,true);
    this->filePtr = pcVar1;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFloat(ai_real& fOut)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        // LOG
        LogWarning("Unable to parse float: unexpected EOL [#1]");
        fOut = 0.0;
        ++iLineNumber;
        return;
    }
    // parse the first float
    filePtr = fast_atoreal_move<ai_real>(filePtr,fOut);
}